

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

QWizardPage * __thiscall QMap<int,_QWizardPage_*>::take(QMap<int,_QWizardPage_*> *this,int *key)

{
  totally_ordered_wrapper<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_*>
  tVar1;
  QWizardPage *pQVar2;
  long in_FS_OFFSET;
  node_type local_48;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_>
  local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  tVar1.ptr = (this->d).d.ptr;
  if (tVar1.ptr ==
      (QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
       *)0x0) {
    pQVar2 = (QWizardPage *)0x0;
  }
  else {
    if ((__atomic_base<int>)
        *(__int_type *)
         &((tVar1.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1) {
      local_30.d.ptr =
           (totally_ordered_wrapper<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_*>
            )(QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
              *)0x0;
    }
    else {
      LOCK();
      ((tVar1.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value = (Type)((int)((tVar1.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                             super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
      local_30.d.ptr =
           (totally_ordered_wrapper<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_*>
            )(totally_ordered_wrapper<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_*>
              )tVar1.ptr;
    }
    detach(this);
    local_48._M_pmapped =
         (__pointer<typename_pair<const_int,_QWizardPage_*>::second_type>)&DAT_aaaaaaaaaaaaaaaa;
    local_48.
    super__Node_handle_common<std::pair<const_int,_QWizardPage_*>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QWizardPage_*>_>_>_>
    ._M_ptr = (pointer)&DAT_aaaaaaaaaaaaaaaa;
    local_48._M_pkey = (__pointer<int>)&DAT_aaaaaaaaaaaaaaaa;
    std::
    _Rb_tree<int,_std::pair<const_int,_QWizardPage_*>,_std::_Select1st<std::pair<const_int,_QWizardPage_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>
    ::extract(&local_48,&(((this->d).d.ptr)->m)._M_t,key);
    if (local_48.
        super__Node_handle_common<std::pair<const_int,_QWizardPage_*>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QWizardPage_*>_>_>_>
        ._M_ptr == (pointer)0x0) {
      pQVar2 = (QWizardPage *)0x0;
    }
    else {
      pQVar2 = *local_48._M_pmapped;
      operator_delete(local_48.
                      super__Node_handle_common<std::pair<const_int,_QWizardPage_*>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_QWizardPage_*>_>_>_>
                      ._M_ptr,0x30);
    }
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

T take(const Key &key)
    {
        if (!d)
            return T();

        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. There is no need of copying all the
        // elements (the one to be removed can be skipped).
        detach();

#ifdef __cpp_lib_node_extract
        if (const auto node = d->m.extract(key))
            return std::move(node.mapped());
#else
        auto i = d->m.find(key);
        if (i != d->m.end()) {
            // ### breaks RVO on most compilers (but only on old-fashioned ones, so who cares?)
            T result(std::move(i->second));
            d->m.erase(i);
            return result;
        }
#endif
        return T();
    }